

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::GetStateBlock(ChElementHexaCorot_8 *this,ChVectorDynamic<> *mD)

{
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  long start;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  undefined1 local_b8 [16];
  double local_a8;
  ChVector<double> v;
  ChVector<double> *local_78 [2];
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  iVar1 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar1);
  start = 0;
  lVar3 = 0;
  lVar2 = 0;
  while( true ) {
    iVar1 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[3])(this);
    if (iVar1 <= lVar2) break;
    local_e0.m_matrix = &(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_e0,
                      (ChVector<double> *)
                      (*(long *)((long)&(((this->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + lVar3) + 0x20));
    (**(code **)(**(long **)((long)&(((this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar3) + 0x60))(local_d8);
    local_78[0] = &v;
    v.m_data._0_16_ = vsubpd_avx(local_b8,local_d8);
    v.m_data[2] = local_a8 - local_c8;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,mD,start,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x10;
    start = start + 3;
  }
  return;
}

Assistant:

void ChElementHexaCorot_8::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.setZero(this->GetNdofs());

    for (int i = 0; i < GetNnodes(); i++)
        mD.segment(i * 3, 3) = (A.transpose() * this->nodes[i]->GetPos() - nodes[i]->GetX0()).eigen();
}